

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_16777232,_true,_embree::avx::SubdivPatch1MBIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  int iVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  Geometry *pGVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  undefined1 (*pauVar51) [16];
  ulong uVar52;
  long lVar53;
  Primitive *prim;
  ulong uVar54;
  undefined1 (*pauVar55) [16];
  ulong *puVar56;
  ulong uVar57;
  undefined4 uVar58;
  ulong unaff_R14;
  size_t mask;
  bool bVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar73;
  float fVar85;
  float fVar86;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar87;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar120;
  float fVar121;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar124 [32];
  float fVar128;
  undefined1 auVar126 [32];
  float fVar134;
  float fVar135;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar156;
  float fVar157;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar160 [32];
  float fVar164;
  undefined1 auVar162 [32];
  float fVar176;
  undefined1 auVar171 [16];
  float fVar170;
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar194 [64];
  float fVar208;
  float fVar209;
  undefined1 auVar210 [32];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar211 [64];
  float fVar219;
  float fVar220;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar224 [64];
  float fVar237;
  undefined1 auVar238 [32];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar239 [64];
  HitK<1> h;
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int iStack_d68;
  long local_d28;
  undefined1 local_d20 [8];
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  int local_c88;
  int local_c84;
  undefined8 local_c80;
  undefined1 auStack_c78 [8];
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  RayQueryContext *local_c08;
  undefined1 local_c00 [8];
  undefined1 auStack_bf8 [8];
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  Geometry *local_be0;
  undefined1 auStack_bd8 [24];
  undefined4 local_bc0;
  undefined1 auStack_bbc [28];
  undefined8 local_ba0;
  undefined1 auStack_b98 [8];
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  float local_b74;
  float local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  uint local_b64;
  uint local_b60;
  undefined1 (*local_b48) [16];
  ulong local_b40;
  ulong local_b38;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  RTCRayQueryContext *local_ac0;
  undefined1 auStack_ab8 [24];
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined1 (**local_a20) [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  undefined1 auVar104 [24];
  undefined1 auVar106 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [24];
  undefined1 auVar125 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [24];
  undefined1 auVar161 [32];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar120 = ray->tfar, 0.0 <= fVar120)) {
    puVar56 = local_7f8;
    local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    aVar3 = (ray->dir).field_0;
    auVar62 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar91._8_4_ = 0x7fffffff;
    auVar91._0_8_ = 0x7fffffff7fffffff;
    auVar91._12_4_ = 0x7fffffff;
    auVar91 = vandps_avx((undefined1  [16])aVar3,auVar91);
    auVar98._8_4_ = 0x219392ef;
    auVar98._0_8_ = 0x219392ef219392ef;
    auVar98._12_4_ = 0x219392ef;
    auVar91 = vcmpps_avx(auVar91,auVar98,1);
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = &DAT_3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar98 = vdivps_avx(auVar99,(undefined1  [16])aVar3);
    auVar100._8_4_ = 0x5d5e0b6b;
    auVar100._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar100._12_4_ = 0x5d5e0b6b;
    auVar91 = vblendvps_avx(auVar98,auVar100,auVar91);
    auVar109._0_4_ = auVar91._0_4_ * 0.99999964;
    auVar109._4_4_ = auVar91._4_4_ * 0.99999964;
    auVar109._8_4_ = auVar91._8_4_ * 0.99999964;
    auVar109._12_4_ = auVar91._12_4_ * 0.99999964;
    auVar74._0_4_ = auVar91._0_4_ * 1.0000004;
    auVar74._4_4_ = auVar91._4_4_ * 1.0000004;
    auVar74._8_4_ = auVar91._8_4_ * 1.0000004;
    auVar74._12_4_ = auVar91._12_4_ * 1.0000004;
    uVar58 = *(undefined4 *)&(ray->org).field_0;
    local_c20._4_4_ = uVar58;
    local_c20._0_4_ = uVar58;
    local_c20._8_4_ = uVar58;
    local_c20._12_4_ = uVar58;
    auVar182 = ZEXT1664(local_c20);
    uVar58 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    local_c30._4_4_ = uVar58;
    local_c30._0_4_ = uVar58;
    local_c30._8_4_ = uVar58;
    local_c30._12_4_ = uVar58;
    auVar194 = ZEXT1664(local_c30);
    uVar58 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    local_c40._4_4_ = uVar58;
    local_c40._0_4_ = uVar58;
    local_c40._8_4_ = uVar58;
    local_c40._12_4_ = uVar58;
    auVar211 = ZEXT1664(local_c40);
    local_c50 = vshufps_avx(auVar109,auVar109,0);
    auVar224 = ZEXT1664(local_c50);
    auVar91 = vmovshdup_avx(auVar109);
    local_c60 = vshufps_avx(auVar109,auVar109,0x55);
    auVar239 = ZEXT1664(local_c60);
    auVar98 = vshufpd_avx(auVar109,auVar109,1);
    auVar99 = vshufps_avx(auVar109,auVar109,0xaa);
    auVar100 = vshufps_avx(auVar74,auVar74,0);
    auVar6 = vshufps_avx(auVar74,auVar74,0x55);
    auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
    uVar49 = (ulong)(auVar109._0_4_ < 0.0) * 0x10;
    uVar52 = (ulong)(auVar91._0_4_ < 0.0) << 4 | 0x20;
    uVar57 = (ulong)(auVar98._0_4_ < 0.0) << 4 | 0x40;
    auVar91 = vshufps_avx(auVar62,auVar62,0);
    auVar98 = vshufps_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),0);
    local_920._16_16_ = mm_lookupmask_ps._240_16_;
    local_920._0_16_ = mm_lookupmask_ps._240_16_;
    local_d28 = 0;
    local_c08 = context;
    do {
      if (puVar56 == &local_800) {
        return;
      }
      uVar54 = puVar56[-1];
      puVar56 = puVar56 + -1;
      do {
        if ((uVar54 & 8) == 0) {
          uVar44 = uVar54 & 0xfffffffffffffff0;
          fVar120 = (ray->dir).field_0.m128[3];
          auVar61._4_4_ = fVar120;
          auVar61._0_4_ = fVar120;
          auVar61._8_4_ = fVar120;
          auVar61._12_4_ = fVar120;
          pfVar2 = (float *)(uVar44 + 0x80 + uVar49);
          pfVar1 = (float *)(uVar44 + 0x20 + uVar49);
          auVar62._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar62._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar62._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar62._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar62 = vsubps_avx(auVar62,auVar182._0_16_);
          auVar112._0_4_ = auVar224._0_4_ * auVar62._0_4_;
          auVar112._4_4_ = auVar224._4_4_ * auVar62._4_4_;
          auVar112._8_4_ = auVar224._8_4_ * auVar62._8_4_;
          auVar112._12_4_ = auVar224._12_4_ * auVar62._12_4_;
          auVar62 = vmaxps_avx(auVar91,auVar112);
          pfVar2 = (float *)(uVar44 + 0x80 + uVar52);
          pfVar1 = (float *)(uVar44 + 0x20 + uVar52);
          auVar171._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar171._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar171._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar171._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar109 = vsubps_avx(auVar171,auVar194._0_16_);
          auVar75._0_4_ = auVar239._0_4_ * auVar109._0_4_;
          auVar75._4_4_ = auVar239._4_4_ * auVar109._4_4_;
          auVar75._8_4_ = auVar239._8_4_ * auVar109._8_4_;
          auVar75._12_4_ = auVar239._12_4_ * auVar109._12_4_;
          pfVar2 = (float *)(uVar44 + 0x80 + uVar57);
          pfVar1 = (float *)(uVar44 + 0x20 + uVar57);
          auVar92._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar92._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar92._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar92._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar109 = vsubps_avx(auVar92,auVar211._0_16_);
          auVar93._0_4_ = auVar99._0_4_ * auVar109._0_4_;
          auVar93._4_4_ = auVar99._4_4_ * auVar109._4_4_;
          auVar93._8_4_ = auVar99._8_4_ * auVar109._8_4_;
          auVar93._12_4_ = auVar99._12_4_ * auVar109._12_4_;
          auVar109 = vmaxps_avx(auVar75,auVar93);
          auVar62 = vmaxps_avx(auVar62,auVar109);
          pfVar2 = (float *)(uVar44 + 0x80 + (uVar49 ^ 0x10));
          pfVar1 = (float *)(uVar44 + 0x20 + (uVar49 ^ 0x10));
          auVar76._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar76._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar76._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar76._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar109 = vsubps_avx(auVar76,auVar182._0_16_);
          auVar77._0_4_ = auVar100._0_4_ * auVar109._0_4_;
          auVar77._4_4_ = auVar100._4_4_ * auVar109._4_4_;
          auVar77._8_4_ = auVar100._8_4_ * auVar109._8_4_;
          auVar77._12_4_ = auVar100._12_4_ * auVar109._12_4_;
          pfVar2 = (float *)(uVar44 + 0x80 + (uVar52 ^ 0x10));
          auVar109 = vminps_avx(auVar98,auVar77);
          pfVar1 = (float *)(uVar44 + 0x20 + (uVar52 ^ 0x10));
          auVar94._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar94._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar94._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar94._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar112 = vsubps_avx(auVar94,auVar194._0_16_);
          pfVar2 = (float *)(uVar44 + 0x80 + (uVar57 ^ 0x10));
          pfVar1 = (float *)(uVar44 + 0x20 + (uVar57 ^ 0x10));
          auVar101._0_4_ = fVar120 * *pfVar2 + *pfVar1;
          auVar101._4_4_ = fVar120 * pfVar2[1] + pfVar1[1];
          auVar101._8_4_ = fVar120 * pfVar2[2] + pfVar1[2];
          auVar101._12_4_ = fVar120 * pfVar2[3] + pfVar1[3];
          auVar95._0_4_ = auVar6._0_4_ * auVar112._0_4_;
          auVar95._4_4_ = auVar6._4_4_ * auVar112._4_4_;
          auVar95._8_4_ = auVar6._8_4_ * auVar112._8_4_;
          auVar95._12_4_ = auVar6._12_4_ * auVar112._12_4_;
          auVar112 = vsubps_avx(auVar101,auVar211._0_16_);
          auVar102._0_4_ = auVar74._0_4_ * auVar112._0_4_;
          auVar102._4_4_ = auVar74._4_4_ * auVar112._4_4_;
          auVar102._8_4_ = auVar74._8_4_ * auVar112._8_4_;
          auVar102._12_4_ = auVar74._12_4_ * auVar112._12_4_;
          auVar112 = vminps_avx(auVar95,auVar102);
          auVar109 = vminps_avx(auVar109,auVar112);
          if (((uint)uVar54 & 7) == 6) {
            auVar109 = vcmpps_avx(auVar62,auVar109,2);
            auVar62 = vcmpps_avx(*(undefined1 (*) [16])(uVar44 + 0xe0),auVar61,2);
            auVar112 = vcmpps_avx(auVar61,*(undefined1 (*) [16])(uVar44 + 0xf0),1);
            auVar62 = vandps_avx(auVar62,auVar112);
            auVar62 = vandps_avx(auVar62,auVar109);
          }
          else {
            auVar62 = vcmpps_avx(auVar62,auVar109,2);
          }
          auVar62 = vpslld_avx(auVar62,0x1f);
          uVar58 = vmovmskps_avx(auVar62);
          unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar58);
        }
        if ((uVar54 & 8) == 0) {
          if (unaff_R14 == 0) {
            iStack_d68 = 4;
          }
          else {
            uVar44 = uVar54 & 0xfffffffffffffff0;
            lVar46 = 0;
            if (unaff_R14 != 0) {
              for (; (unaff_R14 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            iStack_d68 = 0;
            uVar54 = *(ulong *)(uVar44 + lVar46 * 8);
            uVar48 = unaff_R14 - 1 & unaff_R14;
            if (uVar48 != 0) {
              *puVar56 = uVar54;
              lVar46 = 0;
              if (uVar48 != 0) {
                for (; (uVar48 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              uVar45 = uVar48 - 1;
              while( true ) {
                puVar56 = puVar56 + 1;
                uVar54 = *(ulong *)(uVar44 + lVar46 * 8);
                uVar45 = uVar45 & uVar48;
                if (uVar45 == 0) break;
                *puVar56 = uVar54;
                lVar46 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                uVar48 = uVar45 - 1;
              }
            }
          }
        }
        else {
          iStack_d68 = 6;
        }
      } while (iStack_d68 == 0);
      if (iStack_d68 == 6) {
        if (((uint)uVar54 & 0xf) == 8) {
          uVar4 = *(uint *)(local_d28 + 0xc);
          local_b40 = (ulong)uVar4;
          uVar5 = *(uint *)(local_d28 + 0x10);
          local_b38 = (ulong)uVar5;
          lVar50 = (ulong)*(uint *)(local_d28 + 0x24) + local_d28 +
                   (long)local_c88 * (ulong)*(uint *)(local_d28 + 0x28);
          uVar54 = uVar54 >> 4;
          lVar46 = lVar50 + uVar54 * 4;
          lVar53 = lVar50 + uVar54 * 4 + 0x2c;
          auVar62 = *(undefined1 (*) [16])(lVar46 + 0x2c + local_b40 * 4);
          auVar109 = auVar62;
          if (2 < local_b38) {
            auVar109 = *(undefined1 (*) [16])(lVar53 + local_b40 * 8);
          }
          auVar112 = *(undefined1 (*) [16])(lVar50 + 0x2c + uVar54 * 4);
          if (local_b40 == 2) {
            auVar112 = vshufps_avx(auVar112,auVar112,0x54);
            auVar62 = vshufps_avx(auVar62,auVar62,0x54);
            auVar109 = vshufps_avx(auVar109,auVar109,0x54);
          }
          uVar54 = (ulong)*(uint *)(local_d28 + 0x14);
          pauVar51 = (undefined1 (*) [16])(lVar46 + uVar54 * 4 + 0x2c);
          auVar61 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 4);
          auVar171 = auVar61;
          if (2 < uVar5) {
            auVar171 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 8);
          }
          _local_c00 = *pauVar51;
          if (uVar4 == 2) {
            _local_c00 = vshufps_avx(_local_c00,_local_c00,0x54);
            auVar61 = vshufps_avx(auVar61,auVar61,0x54);
            auVar171 = vshufps_avx(auVar171,auVar171,0x54);
          }
          pauVar55 = (undefined1 (*) [16])(lVar46 + uVar54 * 8 + 0x2c);
          auVar75 = *(undefined1 (*) [16])(*pauVar55 + local_b40 * 4);
          auVar76 = auVar75;
          if (2 < uVar5) {
            auVar76 = *(undefined1 (*) [16])(*pauVar55 + local_b40 * 8);
          }
          auVar77 = *pauVar55;
          if (uVar4 == 2) {
            auVar77 = vshufps_avx(auVar77,auVar77,0x54);
            auVar75 = vshufps_avx(auVar75,auVar75,0x54);
            auVar76 = vshufps_avx(auVar76,auVar76,0x54);
          }
          uVar44 = (ulong)(*(uint *)(local_d28 + 0x28) & 0xfffffffc);
          auVar92 = *(undefined1 (*) [16])(lVar53 + uVar44 + local_b40 * 4);
          auVar93 = auVar92;
          if (2 < uVar5) {
            auVar93 = *(undefined1 (*) [16])(lVar53 + uVar44 + local_b40 * 8);
          }
          auVar94 = *(undefined1 (*) [16])(lVar53 + uVar44);
          if (uVar4 == 2) {
            auVar94 = vshufps_avx(auVar94,auVar94,0x54);
            auVar92 = vshufps_avx(auVar92,auVar92,0x54);
            auVar93 = vshufps_avx(auVar93,auVar93,0x54);
          }
          pauVar51 = (undefined1 (*) [16])(*pauVar51 + uVar44);
          auVar95 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 4);
          auVar101 = auVar95;
          if (2 < uVar5) {
            auVar101 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 8);
          }
          auVar102 = *pauVar51;
          if (uVar4 == 2) {
            auVar102 = vshufps_avx(auVar102,auVar102,0x54);
            auVar95 = vshufps_avx(auVar95,auVar95,0x54);
            auVar101 = vshufps_avx(auVar101,auVar101,0x54);
          }
          pauVar51 = (undefined1 (*) [16])(*pauVar55 + uVar44);
          auVar103 = *pauVar51;
          auVar122 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 4);
          auVar158 = auVar122;
          if (2 < uVar5) {
            auVar158 = *(undefined1 (*) [16])(*pauVar51 + local_b40 * 8);
          }
          auVar192._16_16_ = auVar62;
          auVar192._0_16_ = auVar112;
          auVar63._16_16_ = auVar109;
          auVar63._0_16_ = auVar62;
          auVar7 = vunpcklps_avx(auVar192,auVar63);
          auVar192 = vshufps_avx(auVar192,auVar192,0xa5);
          auVar63 = vshufps_avx(auVar63,auVar63,0x94);
          auVar78._16_16_ = auVar61;
          auVar78._0_16_ = _local_c00;
          auVar105._16_16_ = auVar171;
          auVar105._0_16_ = auVar61;
          auVar8 = vunpcklps_avx(auVar78,auVar105);
          auVar78 = vshufps_avx(auVar78,auVar78,0xa5);
          auVar105 = vshufps_avx(auVar105,auVar105,0x94);
          auVar79._16_16_ = auVar75;
          auVar79._0_16_ = auVar77;
          auVar113._16_16_ = auVar76;
          auVar113._0_16_ = auVar75;
          auVar9 = vunpcklps_avx(auVar79,auVar113);
          auVar79 = vshufps_avx(auVar79,auVar79,0xa5);
          auVar113 = vshufps_avx(auVar113,auVar113,0x94);
          auVar114._16_16_ = auVar92;
          auVar114._0_16_ = auVar94;
          auVar172._16_16_ = auVar93;
          auVar172._0_16_ = auVar92;
          auVar10 = vunpcklps_avx(auVar114,auVar172);
          auVar114 = vshufps_avx(auVar114,auVar114,0xa5);
          auVar172 = vshufps_avx(auVar172,auVar172,0x94);
          auVar68._16_16_ = auVar95;
          auVar68._0_16_ = auVar102;
          auVar221._16_16_ = auVar101;
          auVar221._0_16_ = auVar95;
          auVar11 = vunpcklps_avx(auVar68,auVar221);
          auVar68 = vshufps_avx(auVar68,auVar68,0xa5);
          auVar221 = vshufps_avx(auVar221,auVar221,0x94);
          if (uVar4 == 2) {
            auVar103 = vshufps_avx(auVar103,auVar103,0x54);
            auVar122 = vshufps_avx(auVar122,auVar122,0x54);
            auVar158 = vshufps_avx(auVar158,auVar158,0x54);
          }
          auVar222._16_16_ = auVar122;
          auVar222._0_16_ = auVar103;
          auVar181._16_16_ = auVar158;
          auVar181._0_16_ = auVar122;
          auVar62 = vshufps_avx(local_a90,local_a90,0);
          auVar109 = ZEXT416((uint)(1.0 - local_a90._0_4_));
          auVar109 = vshufps_avx(auVar109,auVar109,0);
          fVar189 = auVar62._0_4_;
          fVar195 = auVar62._4_4_;
          fVar71 = auVar62._8_4_;
          fVar72 = auVar62._12_4_;
          local_ba0._0_4_ = auVar7._0_4_;
          local_ba0._4_4_ = auVar7._4_4_;
          auStack_b98._0_4_ = auVar7._8_4_;
          auStack_b98._4_4_ = auVar7._12_4_;
          fStack_b90 = auVar7._16_4_;
          fStack_b8c = auVar7._20_4_;
          fStack_b88 = auVar7._24_4_;
          fVar127 = auVar109._0_4_;
          fVar138 = auVar109._4_4_;
          fVar141 = auVar109._8_4_;
          fVar144 = auVar109._12_4_;
          local_d20._4_4_ = fVar138 * local_ba0._4_4_ + fVar195 * auVar10._4_4_;
          local_d20._0_4_ = fVar127 * (float)local_ba0 + fVar189 * auVar10._0_4_;
          fStack_d18 = fVar141 * (float)auStack_b98._0_4_ + fVar71 * auVar10._8_4_;
          fStack_d14 = fVar144 * (float)auStack_b98._4_4_ + fVar72 * auVar10._12_4_;
          fStack_d10 = fVar127 * fStack_b90 + fVar189 * auVar10._16_4_;
          fStack_d0c = fVar138 * fStack_b8c + fVar195 * auVar10._20_4_;
          fStack_d08 = fVar141 * fStack_b88 + fVar71 * auVar10._24_4_;
          fStack_d04 = auVar10._28_4_ + 0.0;
          auVar80._0_4_ = fVar127 * auVar8._0_4_ + fVar189 * auVar11._0_4_;
          auVar80._4_4_ = fVar138 * auVar8._4_4_ + fVar195 * auVar11._4_4_;
          auVar80._8_4_ = fVar141 * auVar8._8_4_ + fVar71 * auVar11._8_4_;
          auVar80._12_4_ = fVar144 * auVar8._12_4_ + fVar72 * auVar11._12_4_;
          auVar80._16_4_ = fVar127 * auVar8._16_4_ + fVar189 * auVar11._16_4_;
          auVar80._20_4_ = fVar138 * auVar8._20_4_ + fVar195 * auVar11._20_4_;
          auVar80._24_4_ = fVar141 * auVar8._24_4_ + fVar71 * auVar11._24_4_;
          auVar80._28_4_ = auVar8._28_4_ + 0.0;
          auVar7 = vunpcklps_avx(auVar222,auVar181);
          auVar110._0_4_ = fVar127 * auVar9._0_4_ + fVar189 * auVar7._0_4_;
          auVar110._4_4_ = fVar138 * auVar9._4_4_ + fVar195 * auVar7._4_4_;
          auVar110._8_4_ = fVar141 * auVar9._8_4_ + fVar71 * auVar7._8_4_;
          auVar110._12_4_ = fVar144 * auVar9._12_4_ + fVar72 * auVar7._12_4_;
          auVar110._16_4_ = fVar127 * auVar9._16_4_ + fVar189 * auVar7._16_4_;
          auVar110._20_4_ = fVar138 * auVar9._20_4_ + fVar195 * auVar7._20_4_;
          auVar110._24_4_ = fVar141 * auVar9._24_4_ + fVar71 * auVar7._24_4_;
          auVar110._28_4_ = auVar9._28_4_ + auVar7._28_4_;
          local_ae0._0_4_ = auVar192._0_4_;
          local_ae0._4_4_ = auVar192._4_4_;
          fStack_ad8 = auVar192._8_4_;
          fStack_ad4 = auVar192._12_4_;
          fStack_ad0 = auVar192._16_4_;
          fStack_acc = auVar192._20_4_;
          fStack_ac8 = auVar192._24_4_;
          auVar124._0_4_ = fVar127 * (float)local_ae0._0_4_ + fVar189 * auVar114._0_4_;
          auVar124._4_4_ = fVar138 * (float)local_ae0._4_4_ + fVar195 * auVar114._4_4_;
          auVar124._8_4_ = fVar141 * fStack_ad8 + fVar71 * auVar114._8_4_;
          auVar124._12_4_ = fVar144 * fStack_ad4 + fVar72 * auVar114._12_4_;
          auVar124._16_4_ = fVar127 * fStack_ad0 + fVar189 * auVar114._16_4_;
          auVar124._20_4_ = fVar138 * fStack_acc + fVar195 * auVar114._20_4_;
          auVar124._24_4_ = fVar141 * fStack_ac8 + fVar71 * auVar114._24_4_;
          auVar124._28_4_ = auVar114._28_4_ + auVar9._28_4_;
          auVar192 = vshufps_avx(auVar222,auVar222,0xa5);
          auVar114 = vshufps_avx(auVar181,auVar181,0x94);
          local_b00._0_4_ = auVar78._0_4_;
          local_b00._4_4_ = auVar78._4_4_;
          fStack_af8 = auVar78._8_4_;
          fStack_af4 = auVar78._12_4_;
          fStack_af0 = auVar78._16_4_;
          fStack_aec = auVar78._20_4_;
          fStack_ae8 = auVar78._24_4_;
          auVar64._0_4_ = fVar189 * auVar68._0_4_ + fVar127 * (float)local_b00._0_4_;
          auVar64._4_4_ = fVar195 * auVar68._4_4_ + fVar138 * (float)local_b00._4_4_;
          auVar64._8_4_ = fVar71 * auVar68._8_4_ + fVar141 * fStack_af8;
          auVar64._12_4_ = fVar72 * auVar68._12_4_ + fVar144 * fStack_af4;
          auVar64._16_4_ = fVar189 * auVar68._16_4_ + fVar127 * fStack_af0;
          auVar64._20_4_ = fVar195 * auVar68._20_4_ + fVar138 * fStack_aec;
          auVar64._24_4_ = fVar71 * auVar68._24_4_ + fVar141 * fStack_ae8;
          auVar64._28_4_ = auVar68._28_4_ + 0.0;
          fVar120 = auVar79._28_4_;
          auVar160._0_4_ = fVar189 * auVar192._0_4_ + fVar127 * auVar79._0_4_;
          auVar160._4_4_ = fVar195 * auVar192._4_4_ + fVar138 * auVar79._4_4_;
          auVar160._8_4_ = fVar71 * auVar192._8_4_ + fVar141 * auVar79._8_4_;
          auVar160._12_4_ = fVar72 * auVar192._12_4_ + fVar144 * auVar79._12_4_;
          auVar160._16_4_ = fVar189 * auVar192._16_4_ + fVar127 * auVar79._16_4_;
          auVar160._20_4_ = fVar195 * auVar192._20_4_ + fVar138 * auVar79._20_4_;
          auVar160._24_4_ = fVar71 * auVar192._24_4_ + fVar141 * auVar79._24_4_;
          auVar160._28_4_ = auVar192._28_4_ + fVar120;
          auVar173._0_4_ = fVar127 * auVar63._0_4_ + fVar189 * auVar172._0_4_;
          auVar173._4_4_ = fVar138 * auVar63._4_4_ + fVar195 * auVar172._4_4_;
          auVar173._8_4_ = fVar141 * auVar63._8_4_ + fVar71 * auVar172._8_4_;
          auVar173._12_4_ = fVar144 * auVar63._12_4_ + fVar72 * auVar172._12_4_;
          auVar173._16_4_ = fVar127 * auVar63._16_4_ + fVar189 * auVar172._16_4_;
          auVar173._20_4_ = fVar138 * auVar63._20_4_ + fVar195 * auVar172._20_4_;
          auVar173._24_4_ = fVar141 * auVar63._24_4_ + fVar71 * auVar172._24_4_;
          auVar173._28_4_ = auVar68._28_4_ + fVar120;
          local_c00._0_4_ = auVar105._0_4_;
          local_c00._4_4_ = auVar105._4_4_;
          auStack_bf8._0_4_ = auVar105._8_4_;
          auStack_bf8._4_4_ = auVar105._12_4_;
          fStack_bf0 = auVar105._16_4_;
          fStack_bec = auVar105._20_4_;
          fStack_be8 = auVar105._24_4_;
          auVar193._0_4_ = fVar127 * (float)local_c00._0_4_ + fVar189 * auVar221._0_4_;
          auVar193._4_4_ = fVar138 * (float)local_c00._4_4_ + fVar195 * auVar221._4_4_;
          auVar193._8_4_ = fVar141 * (float)auStack_bf8._0_4_ + fVar71 * auVar221._8_4_;
          auVar193._12_4_ = fVar144 * (float)auStack_bf8._4_4_ + fVar72 * auVar221._12_4_;
          auVar193._16_4_ = fVar127 * fStack_bf0 + fVar189 * auVar221._16_4_;
          auVar193._20_4_ = fVar138 * fStack_bec + fVar195 * auVar221._20_4_;
          auVar193._24_4_ = fVar141 * fStack_be8 + fVar71 * auVar221._24_4_;
          auVar193._28_4_ = fVar120 + auVar221._28_4_;
          local_c80._0_4_ = auVar113._0_4_;
          local_c80._4_4_ = auVar113._4_4_;
          auStack_c78._0_4_ = auVar113._8_4_;
          auStack_c78._4_4_ = auVar113._12_4_;
          fStack_c70 = auVar113._16_4_;
          fStack_c6c = auVar113._20_4_;
          fStack_c68 = auVar113._24_4_;
          auVar238._0_4_ = fVar127 * (float)local_c80 + fVar189 * auVar114._0_4_;
          auVar238._4_4_ = fVar138 * local_c80._4_4_ + fVar195 * auVar114._4_4_;
          auVar238._8_4_ = fVar141 * (float)auStack_c78._0_4_ + fVar71 * auVar114._8_4_;
          auVar238._12_4_ = fVar144 * (float)auStack_c78._4_4_ + fVar72 * auVar114._12_4_;
          auVar238._16_4_ = fVar127 * fStack_c70 + fVar189 * auVar114._16_4_;
          auVar238._20_4_ = fVar138 * fStack_c6c + fVar195 * auVar114._20_4_;
          auVar238._24_4_ = fVar141 * fStack_c68 + fVar71 * auVar114._24_4_;
          auVar238._28_4_ = auVar221._28_4_ + auVar172._28_4_;
          uVar58 = *(undefined4 *)&(ray->org).field_0;
          auVar115._4_4_ = uVar58;
          auVar115._0_4_ = uVar58;
          auVar115._8_4_ = uVar58;
          auVar115._12_4_ = uVar58;
          auVar115._16_4_ = uVar58;
          auVar115._20_4_ = uVar58;
          auVar115._24_4_ = uVar58;
          auVar115._28_4_ = uVar58;
          uVar58 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar210._4_4_ = uVar58;
          auVar210._0_4_ = uVar58;
          auVar210._8_4_ = uVar58;
          auVar210._12_4_ = uVar58;
          auVar210._16_4_ = uVar58;
          auVar210._20_4_ = uVar58;
          auVar210._24_4_ = uVar58;
          auVar210._28_4_ = uVar58;
          uVar58 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar223._4_4_ = uVar58;
          auVar223._0_4_ = uVar58;
          auVar223._8_4_ = uVar58;
          auVar223._12_4_ = uVar58;
          auVar223._16_4_ = uVar58;
          auVar223._20_4_ = uVar58;
          auVar223._24_4_ = uVar58;
          auVar223._28_4_ = uVar58;
          _local_ae0 = vsubps_avx(_local_d20,auVar115);
          _local_b00 = vsubps_avx(auVar80,auVar210);
          auVar105 = vsubps_avx(auVar110,auVar223);
          auVar192 = vsubps_avx(auVar124,auVar115);
          auVar63 = vsubps_avx(auVar64,auVar210);
          auVar78 = vsubps_avx(auVar160,auVar223);
          auVar79 = vsubps_avx(auVar173,auVar115);
          auVar113 = vsubps_avx(auVar193,auVar210);
          auVar114 = vsubps_avx(auVar238,auVar223);
          auVar172 = vsubps_avx(auVar79,_local_ae0);
          auVar68 = vsubps_avx(auVar113,_local_b00);
          auVar221 = vsubps_avx(auVar114,auVar105);
          fVar138 = local_b00._0_4_;
          fVar120 = auVar113._0_4_ + fVar138;
          fVar141 = local_b00._4_4_;
          fVar127 = auVar113._4_4_ + fVar141;
          fVar144 = local_b00._8_4_;
          fVar129 = auVar113._8_4_ + fVar144;
          fVar189 = local_b00._12_4_;
          fVar130 = auVar113._12_4_ + fVar189;
          fVar195 = local_b00._16_4_;
          fVar131 = auVar113._16_4_ + fVar195;
          fVar71 = local_b00._20_4_;
          fVar132 = auVar113._20_4_ + fVar71;
          fVar72 = local_b00._24_4_;
          fVar133 = auVar113._24_4_ + fVar72;
          fVar60 = local_b00._28_4_;
          fVar180 = auVar105._0_4_;
          fVar156 = fVar180 + auVar114._0_4_;
          fVar183 = auVar105._4_4_;
          fVar163 = fVar183 + auVar114._4_4_;
          fVar184 = auVar105._8_4_;
          fVar165 = fVar184 + auVar114._8_4_;
          fVar185 = auVar105._12_4_;
          fVar166 = fVar185 + auVar114._12_4_;
          fVar186 = auVar105._16_4_;
          fVar167 = fVar186 + auVar114._16_4_;
          fVar187 = auVar105._20_4_;
          fVar168 = fVar187 + auVar114._20_4_;
          fVar188 = auVar105._24_4_;
          fVar169 = fVar188 + auVar114._24_4_;
          fVar70 = auVar114._28_4_;
          fVar208 = auVar221._0_4_;
          fVar212 = auVar221._4_4_;
          auVar7._4_4_ = fVar212 * fVar127;
          auVar7._0_4_ = fVar208 * fVar120;
          fVar214 = auVar221._8_4_;
          auVar7._8_4_ = fVar214 * fVar129;
          fVar215 = auVar221._12_4_;
          auVar7._12_4_ = fVar215 * fVar130;
          fVar216 = auVar221._16_4_;
          auVar7._16_4_ = fVar216 * fVar131;
          fVar217 = auVar221._20_4_;
          auVar7._20_4_ = fVar217 * fVar132;
          fVar218 = auVar221._24_4_;
          auVar7._24_4_ = fVar218 * fVar133;
          auVar7._28_4_ = auVar173._28_4_;
          fVar237 = auVar68._0_4_;
          fVar240 = auVar68._4_4_;
          auVar8._4_4_ = fVar240 * fVar163;
          auVar8._0_4_ = fVar237 * fVar156;
          fVar241 = auVar68._8_4_;
          auVar8._8_4_ = fVar241 * fVar165;
          fVar242 = auVar68._12_4_;
          auVar8._12_4_ = fVar242 * fVar166;
          fVar243 = auVar68._16_4_;
          auVar8._16_4_ = fVar243 * fVar167;
          fVar244 = auVar68._20_4_;
          auVar8._20_4_ = fVar244 * fVar168;
          fVar245 = auVar68._24_4_;
          auVar8._24_4_ = fVar245 * fVar169;
          auVar8._28_4_ = auVar193._28_4_;
          auVar7 = vsubps_avx(auVar8,auVar7);
          fVar134 = local_ae0._0_4_;
          fVar170 = fVar134 + auVar79._0_4_;
          fVar139 = local_ae0._4_4_;
          fVar174 = fVar139 + auVar79._4_4_;
          fVar142 = local_ae0._8_4_;
          fVar175 = fVar142 + auVar79._8_4_;
          fVar145 = local_ae0._12_4_;
          fVar176 = fVar145 + auVar79._12_4_;
          fVar147 = local_ae0._16_4_;
          fVar177 = fVar147 + auVar79._16_4_;
          fVar150 = local_ae0._20_4_;
          fVar178 = fVar150 + auVar79._20_4_;
          fVar153 = local_ae0._24_4_;
          fVar179 = fVar153 + auVar79._24_4_;
          fVar219 = auVar172._0_4_;
          fVar225 = auVar172._4_4_;
          auVar9._4_4_ = fVar225 * fVar163;
          auVar9._0_4_ = fVar219 * fVar156;
          fVar227 = auVar172._8_4_;
          auVar9._8_4_ = fVar227 * fVar165;
          fVar229 = auVar172._12_4_;
          auVar9._12_4_ = fVar229 * fVar166;
          fVar231 = auVar172._16_4_;
          auVar9._16_4_ = fVar231 * fVar167;
          fVar233 = auVar172._20_4_;
          auVar9._20_4_ = fVar233 * fVar168;
          fVar235 = auVar172._24_4_;
          auVar9._24_4_ = fVar235 * fVar169;
          auVar9._28_4_ = auVar105._28_4_ + fVar70;
          auVar10._4_4_ = fVar212 * fVar174;
          auVar10._0_4_ = fVar208 * fVar170;
          auVar10._8_4_ = fVar214 * fVar175;
          auVar10._12_4_ = fVar215 * fVar176;
          auVar10._16_4_ = fVar216 * fVar177;
          auVar10._20_4_ = fVar217 * fVar178;
          auVar10._24_4_ = fVar218 * fVar179;
          auVar10._28_4_ = auVar221._28_4_;
          auVar8 = vsubps_avx(auVar10,auVar9);
          auVar11._4_4_ = fVar240 * fVar174;
          auVar11._0_4_ = fVar237 * fVar170;
          auVar11._8_4_ = fVar241 * fVar175;
          auVar11._12_4_ = fVar242 * fVar176;
          auVar11._16_4_ = fVar243 * fVar177;
          auVar11._20_4_ = fVar244 * fVar178;
          auVar11._24_4_ = fVar245 * fVar179;
          auVar11._28_4_ = local_ae0._28_4_ + auVar79._28_4_;
          auVar12._4_4_ = fVar225 * fVar127;
          auVar12._0_4_ = fVar219 * fVar120;
          auVar12._8_4_ = fVar227 * fVar129;
          auVar12._12_4_ = fVar229 * fVar130;
          auVar12._16_4_ = fVar231 * fVar131;
          auVar12._20_4_ = fVar233 * fVar132;
          auVar12._24_4_ = fVar235 * fVar133;
          auVar12._28_4_ = auVar113._28_4_ + fVar60;
          auVar9 = vsubps_avx(auVar12,auVar11);
          fVar120 = (ray->dir).field_0.m128[1];
          local_820 = (ray->dir).field_0.m128[2];
          fVar127 = (ray->dir).field_0.m128[0];
          fVar157 = auVar7._0_4_ * fVar127 + fVar120 * auVar8._0_4_ + local_820 * auVar9._0_4_;
          fVar164 = auVar7._4_4_ * fVar127 + fVar120 * auVar8._4_4_ + local_820 * auVar9._4_4_;
          auVar158._0_8_ = CONCAT44(fVar164,fVar157);
          auVar158._8_4_ =
               auVar7._8_4_ * fVar127 + fVar120 * auVar8._8_4_ + local_820 * auVar9._8_4_;
          auVar158._12_4_ =
               auVar7._12_4_ * fVar127 + fVar120 * auVar8._12_4_ + local_820 * auVar9._12_4_;
          auVar159._16_4_ =
               auVar7._16_4_ * fVar127 + fVar120 * auVar8._16_4_ + local_820 * auVar9._16_4_;
          auVar159._0_16_ = auVar158;
          auVar159._20_4_ =
               auVar7._20_4_ * fVar127 + fVar120 * auVar8._20_4_ + local_820 * auVar9._20_4_;
          auVar161._24_4_ =
               auVar7._24_4_ * fVar127 + fVar120 * auVar8._24_4_ + local_820 * auVar9._24_4_;
          auVar161._0_24_ = auVar159;
          auVar161._28_4_ = auVar7._28_4_ + auVar172._28_4_ + auVar9._28_4_;
          local_840 = vsubps_avx(_local_b00,auVar63);
          local_860 = vsubps_avx(auVar105,auVar78);
          fVar220 = fVar138 + auVar63._0_4_;
          fVar226 = fVar141 + auVar63._4_4_;
          fVar228 = fVar144 + auVar63._8_4_;
          fVar230 = fVar189 + auVar63._12_4_;
          fVar232 = fVar195 + auVar63._16_4_;
          fVar234 = fVar71 + auVar63._20_4_;
          fVar236 = fVar72 + auVar63._24_4_;
          fVar129 = fVar180 + auVar78._0_4_;
          fVar163 = fVar183 + auVar78._4_4_;
          fVar166 = fVar184 + auVar78._8_4_;
          fVar168 = fVar185 + auVar78._12_4_;
          fVar170 = fVar186 + auVar78._16_4_;
          fVar175 = fVar187 + auVar78._20_4_;
          fVar176 = fVar188 + auVar78._24_4_;
          fVar130 = local_860._0_4_;
          fVar132 = local_860._4_4_;
          auVar13._4_4_ = fVar226 * fVar132;
          auVar13._0_4_ = fVar220 * fVar130;
          fVar156 = local_860._8_4_;
          auVar13._8_4_ = fVar228 * fVar156;
          fVar165 = local_860._12_4_;
          auVar13._12_4_ = fVar230 * fVar165;
          fVar167 = local_860._16_4_;
          auVar13._16_4_ = fVar232 * fVar167;
          fVar169 = local_860._20_4_;
          auVar13._20_4_ = fVar234 * fVar169;
          fVar174 = local_860._24_4_;
          auVar13._24_4_ = fVar236 * fVar174;
          auVar13._28_4_ = auVar78._28_4_;
          fVar190 = local_840._0_4_;
          fVar196 = local_840._4_4_;
          auVar14._4_4_ = fVar196 * fVar163;
          auVar14._0_4_ = fVar190 * fVar129;
          fVar198 = local_840._8_4_;
          auVar14._8_4_ = fVar198 * fVar166;
          fVar200 = local_840._12_4_;
          auVar14._12_4_ = fVar200 * fVar168;
          fVar202 = local_840._16_4_;
          auVar14._16_4_ = fVar202 * fVar170;
          fVar204 = local_840._20_4_;
          auVar14._20_4_ = fVar204 * fVar175;
          fVar206 = local_840._24_4_;
          auVar14._24_4_ = fVar206 * fVar176;
          auVar14._28_4_ = fVar60;
          auVar7 = vsubps_avx(auVar14,auVar13);
          local_880 = vsubps_avx(_local_ae0,auVar192);
          fVar131 = local_880._0_4_;
          fVar133 = local_880._4_4_;
          auVar15._4_4_ = fVar163 * fVar133;
          auVar15._0_4_ = fVar129 * fVar131;
          fVar163 = local_880._8_4_;
          auVar15._8_4_ = fVar166 * fVar163;
          fVar166 = local_880._12_4_;
          auVar15._12_4_ = fVar168 * fVar166;
          fVar168 = local_880._16_4_;
          auVar15._16_4_ = fVar170 * fVar168;
          fVar170 = local_880._20_4_;
          auVar15._20_4_ = fVar175 * fVar170;
          fVar175 = local_880._24_4_;
          auVar15._24_4_ = fVar176 * fVar175;
          auVar15._28_4_ = fVar60;
          fVar176 = fVar134 + auVar192._0_4_;
          fVar177 = fVar139 + auVar192._4_4_;
          fVar178 = fVar142 + auVar192._8_4_;
          fVar179 = fVar145 + auVar192._12_4_;
          fVar148 = fVar147 + auVar192._16_4_;
          fVar151 = fVar150 + auVar192._20_4_;
          fVar154 = fVar153 + auVar192._24_4_;
          fVar129 = auVar192._28_4_;
          auVar10 = local_860;
          auVar16._4_4_ = fVar177 * fVar132;
          auVar16._0_4_ = fVar176 * fVar130;
          auVar16._8_4_ = fVar178 * fVar156;
          auVar16._12_4_ = fVar179 * fVar165;
          auVar16._16_4_ = fVar148 * fVar167;
          auVar16._20_4_ = fVar151 * fVar169;
          auVar16._24_4_ = fVar154 * fVar174;
          auVar16._28_4_ = fVar129;
          auVar8 = vsubps_avx(auVar16,auVar15);
          auVar17._4_4_ = fVar196 * fVar177;
          auVar17._0_4_ = fVar190 * fVar176;
          auVar17._8_4_ = fVar198 * fVar178;
          auVar17._12_4_ = fVar200 * fVar179;
          auVar17._16_4_ = fVar202 * fVar148;
          auVar17._20_4_ = fVar204 * fVar151;
          auVar17._24_4_ = fVar206 * fVar154;
          auVar17._28_4_ = fVar129;
          auVar18._4_4_ = fVar226 * fVar133;
          auVar18._0_4_ = fVar220 * fVar131;
          auVar18._8_4_ = fVar228 * fVar163;
          auVar18._12_4_ = fVar230 * fVar166;
          auVar18._16_4_ = fVar232 * fVar168;
          auVar18._20_4_ = fVar234 * fVar170;
          auVar18._24_4_ = fVar236 * fVar175;
          auVar18._28_4_ = local_ae0._28_4_ + fVar129;
          auVar9 = vsubps_avx(auVar18,auVar17);
          local_c00._0_4_ = auVar7._0_4_;
          local_c00._4_4_ = auVar7._4_4_;
          auStack_bf8._0_4_ = auVar7._8_4_;
          auStack_bf8._4_4_ = auVar7._12_4_;
          fStack_bf0 = auVar7._16_4_;
          fStack_bec = auVar7._20_4_;
          fStack_be8 = auVar7._24_4_;
          fVar121 = fVar127 * (float)local_c00._0_4_ +
                    fVar120 * auVar8._0_4_ + local_820 * auVar9._0_4_;
          fVar128 = fVar127 * (float)local_c00._4_4_ +
                    fVar120 * auVar8._4_4_ + local_820 * auVar9._4_4_;
          auVar122._0_8_ = CONCAT44(fVar128,fVar121);
          auVar122._8_4_ =
               fVar127 * (float)auStack_bf8._0_4_ +
               fVar120 * auVar8._8_4_ + local_820 * auVar9._8_4_;
          auVar122._12_4_ =
               fVar127 * (float)auStack_bf8._4_4_ +
               fVar120 * auVar8._12_4_ + local_820 * auVar9._12_4_;
          auVar123._16_4_ =
               fVar127 * fStack_bf0 + fVar120 * auVar8._16_4_ + local_820 * auVar9._16_4_;
          auVar123._0_16_ = auVar122;
          auVar123._20_4_ =
               fVar127 * fStack_bec + fVar120 * auVar8._20_4_ + local_820 * auVar9._20_4_;
          auVar125._24_4_ =
               fVar127 * fStack_be8 + fVar120 * auVar8._24_4_ + local_820 * auVar9._24_4_;
          auVar125._0_24_ = auVar123;
          auVar125._28_4_ = fVar60 + auVar8._28_4_ + auVar9._28_4_;
          local_8c0 = auVar125;
          auVar9 = local_8c0;
          auVar8 = vsubps_avx(auVar192,auVar79);
          fVar60 = auVar192._0_4_ + auVar79._0_4_;
          fVar176 = auVar192._4_4_ + auVar79._4_4_;
          fVar177 = auVar192._8_4_ + auVar79._8_4_;
          fVar178 = auVar192._12_4_ + auVar79._12_4_;
          fVar179 = auVar192._16_4_ + auVar79._16_4_;
          fVar148 = auVar192._20_4_ + auVar79._20_4_;
          fVar151 = auVar192._24_4_ + auVar79._24_4_;
          auVar192 = vsubps_avx(auVar63,auVar113);
          fVar154 = auVar63._0_4_ + auVar113._0_4_;
          fVar220 = auVar63._4_4_ + auVar113._4_4_;
          fVar226 = auVar63._8_4_ + auVar113._8_4_;
          fVar228 = auVar63._12_4_ + auVar113._12_4_;
          fVar230 = auVar63._16_4_ + auVar113._16_4_;
          fVar232 = auVar63._20_4_ + auVar113._20_4_;
          fVar234 = auVar63._24_4_ + auVar113._24_4_;
          fVar236 = auVar63._28_4_ + auVar113._28_4_;
          auVar113 = vsubps_avx(auVar78,auVar114);
          fVar73 = auVar78._0_4_ + auVar114._0_4_;
          fVar85 = auVar78._4_4_ + auVar114._4_4_;
          fVar86 = auVar78._8_4_ + auVar114._8_4_;
          fVar87 = auVar78._12_4_ + auVar114._12_4_;
          fVar88 = auVar78._16_4_ + auVar114._16_4_;
          fVar89 = auVar78._20_4_ + auVar114._20_4_;
          fVar90 = auVar78._24_4_ + auVar114._24_4_;
          fVar191 = auVar113._0_4_;
          fVar197 = auVar113._4_4_;
          auVar19._4_4_ = fVar197 * fVar220;
          auVar19._0_4_ = fVar191 * fVar154;
          fVar199 = auVar113._8_4_;
          auVar19._8_4_ = fVar199 * fVar226;
          fVar201 = auVar113._12_4_;
          auVar19._12_4_ = fVar201 * fVar228;
          fVar203 = auVar113._16_4_;
          auVar19._16_4_ = fVar203 * fVar230;
          fVar205 = auVar113._20_4_;
          auVar19._20_4_ = fVar205 * fVar232;
          fVar207 = auVar113._24_4_;
          auVar19._24_4_ = fVar207 * fVar234;
          auVar19._28_4_ = auVar63._28_4_;
          fVar135 = auVar192._0_4_;
          fVar140 = auVar192._4_4_;
          auVar20._4_4_ = fVar140 * fVar85;
          auVar20._0_4_ = fVar135 * fVar73;
          fVar143 = auVar192._8_4_;
          auVar20._8_4_ = fVar143 * fVar86;
          fVar146 = auVar192._12_4_;
          auVar20._12_4_ = fVar146 * fVar87;
          fVar149 = auVar192._16_4_;
          auVar20._16_4_ = fVar149 * fVar88;
          fVar152 = auVar192._20_4_;
          auVar20._20_4_ = fVar152 * fVar89;
          fVar155 = auVar192._24_4_;
          auVar20._24_4_ = fVar155 * fVar90;
          auVar20._28_4_ = fVar70;
          auVar192 = vsubps_avx(auVar20,auVar19);
          fVar209 = auVar8._0_4_;
          fVar213 = auVar8._4_4_;
          auVar21._4_4_ = fVar213 * fVar85;
          auVar21._0_4_ = fVar209 * fVar73;
          fVar73 = auVar8._8_4_;
          auVar21._8_4_ = fVar73 * fVar86;
          fVar85 = auVar8._12_4_;
          auVar21._12_4_ = fVar85 * fVar87;
          fVar86 = auVar8._16_4_;
          auVar21._16_4_ = fVar86 * fVar88;
          fVar87 = auVar8._20_4_;
          auVar21._20_4_ = fVar87 * fVar89;
          fVar88 = auVar8._24_4_;
          auVar21._24_4_ = fVar88 * fVar90;
          auVar21._28_4_ = auVar78._28_4_ + fVar70;
          auVar22._4_4_ = fVar197 * fVar176;
          auVar22._0_4_ = fVar191 * fVar60;
          auVar22._8_4_ = fVar199 * fVar177;
          auVar22._12_4_ = fVar201 * fVar178;
          auVar22._16_4_ = fVar203 * fVar179;
          auVar22._20_4_ = fVar205 * fVar148;
          auVar22._24_4_ = fVar207 * fVar151;
          auVar22._28_4_ = fVar70;
          auVar63 = vsubps_avx(auVar22,auVar21);
          auVar23._4_4_ = fVar140 * fVar176;
          auVar23._0_4_ = fVar135 * fVar60;
          auVar23._8_4_ = fVar143 * fVar177;
          auVar23._12_4_ = fVar146 * fVar178;
          auVar23._16_4_ = fVar149 * fVar179;
          auVar23._20_4_ = fVar152 * fVar148;
          auVar23._24_4_ = fVar155 * fVar151;
          auVar23._28_4_ = fVar129 + auVar79._28_4_;
          auVar24._4_4_ = fVar213 * fVar220;
          auVar24._0_4_ = fVar209 * fVar154;
          auVar24._8_4_ = fVar73 * fVar226;
          auVar24._12_4_ = fVar85 * fVar228;
          auVar24._16_4_ = fVar86 * fVar230;
          auVar24._20_4_ = fVar87 * fVar232;
          auVar24._24_4_ = fVar88 * fVar234;
          auVar24._28_4_ = fVar236;
          auVar78 = vsubps_avx(auVar24,auVar23);
          fStack_81c = local_820;
          fStack_818 = local_820;
          fStack_814 = local_820;
          fStack_810 = local_820;
          fStack_80c = local_820;
          fStack_808 = local_820;
          fStack_804 = local_820;
          auVar65._0_4_ =
               fVar127 * auVar192._0_4_ + fVar120 * auVar63._0_4_ + local_820 * auVar78._0_4_;
          auVar65._4_4_ =
               fVar127 * auVar192._4_4_ + fVar120 * auVar63._4_4_ + local_820 * auVar78._4_4_;
          auVar65._8_4_ =
               fVar127 * auVar192._8_4_ + fVar120 * auVar63._8_4_ + local_820 * auVar78._8_4_;
          auVar65._12_4_ =
               fVar127 * auVar192._12_4_ + fVar120 * auVar63._12_4_ + local_820 * auVar78._12_4_;
          auVar65._16_4_ =
               fVar127 * auVar192._16_4_ + fVar120 * auVar63._16_4_ + local_820 * auVar78._16_4_;
          auVar65._20_4_ =
               fVar127 * auVar192._20_4_ + fVar120 * auVar63._20_4_ + local_820 * auVar78._20_4_;
          auVar65._24_4_ =
               fVar127 * auVar192._24_4_ + fVar120 * auVar63._24_4_ + local_820 * auVar78._24_4_;
          auVar65._28_4_ = fVar236 + fVar236 + auVar78._28_4_;
          fVar148 = auVar65._0_4_ + fVar157 + fVar121;
          fVar151 = auVar65._4_4_ + fVar164 + fVar128;
          auVar103._0_8_ = CONCAT44(fVar151,fVar148);
          auVar103._8_4_ = auVar65._8_4_ + auVar158._8_4_ + auVar122._8_4_;
          auVar103._12_4_ = auVar65._12_4_ + auVar158._12_4_ + auVar122._12_4_;
          auVar104._16_4_ = auVar65._16_4_ + auVar159._16_4_ + auVar123._16_4_;
          auVar104._0_16_ = auVar103;
          auVar104._20_4_ = auVar65._20_4_ + auVar159._20_4_ + auVar123._20_4_;
          auVar106._24_4_ = auVar65._24_4_ + auVar161._24_4_ + auVar125._24_4_;
          auVar106._0_24_ = auVar104;
          auVar106._28_4_ = auVar65._28_4_ + auVar161._28_4_ + auVar125._28_4_;
          auVar116._8_4_ = 0x7fffffff;
          auVar116._0_8_ = 0x7fffffff7fffffff;
          auVar116._12_4_ = 0x7fffffff;
          auVar116._16_4_ = 0x7fffffff;
          auVar116._20_4_ = 0x7fffffff;
          auVar116._24_4_ = 0x7fffffff;
          auVar116._28_4_ = 0x7fffffff;
          auVar192 = vandps_avx(auVar106,auVar116);
          fVar60 = auVar192._0_4_ * 1.1920929e-07;
          fVar70 = auVar192._4_4_ * 1.1920929e-07;
          auVar25._4_4_ = fVar70;
          auVar25._0_4_ = fVar60;
          fVar129 = auVar192._8_4_ * 1.1920929e-07;
          auVar25._8_4_ = fVar129;
          fVar176 = auVar192._12_4_ * 1.1920929e-07;
          auVar25._12_4_ = fVar176;
          fVar177 = auVar192._16_4_ * 1.1920929e-07;
          auVar25._16_4_ = fVar177;
          fVar178 = auVar192._20_4_ * 1.1920929e-07;
          auVar25._20_4_ = fVar178;
          uVar4 = auVar192._28_4_;
          fVar179 = auVar192._24_4_ * 1.1920929e-07;
          auVar25._24_4_ = fVar179;
          auVar25._28_4_ = uVar4;
          auVar192 = vminps_avx(auVar161,auVar125);
          auVar192 = vminps_avx(auVar192,auVar65);
          auVar96._0_8_ = CONCAT44(fVar70,fVar60) ^ 0x8000000080000000;
          auVar96._8_4_ = -fVar129;
          auVar96._12_4_ = -fVar176;
          auVar96._16_4_ = -fVar177;
          auVar96._20_4_ = -fVar178;
          auVar96._24_4_ = -fVar179;
          auVar96._28_4_ = uVar4 ^ 0x80000000;
          auVar192 = vcmpps_avx(auVar192,auVar96,5);
          local_8a0 = auVar161;
          auVar79 = local_8a0;
          auVar78 = vmaxps_avx(auVar161,auVar125);
          auVar63 = vmaxps_avx(auVar78,auVar65);
          auVar63 = vcmpps_avx(auVar63,auVar25,2);
          local_8e0 = vorps_avx(auVar192,auVar63);
          local_b48 = (undefined1 (*) [16])(lVar46 + uVar54 * 0xc + 0x2c);
          local_c00 = (undefined1  [8])CONCAT44(0,*(uint *)(local_d28 + 0x18));
          _auStack_bf8 = auVar7._8_24_;
          local_b6c = *(undefined4 *)(local_d28 + 0x1c);
          auVar63 = local_920 & local_8e0;
          if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar63 >> 0x7f,0) == '\0') &&
                (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar63 >> 0xbf,0) == '\0') &&
              (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar63[0x1f]) {
LAB_002e28fc:
            bVar59 = false;
LAB_002e2917:
            auVar194 = ZEXT1664(local_c30);
            auVar182 = ZEXT1664(local_c20);
            auVar239 = ZEXT1664(local_c60);
            auVar224 = ZEXT1664(local_c50);
            auVar211 = ZEXT1664(local_c40);
          }
          else {
            local_900 = auVar106;
            auVar114 = local_900;
            auVar26._4_4_ = fVar196 * fVar212;
            auVar26._0_4_ = fVar190 * fVar208;
            auVar26._8_4_ = fVar198 * fVar214;
            auVar26._12_4_ = fVar200 * fVar215;
            auVar26._16_4_ = fVar202 * fVar216;
            auVar26._20_4_ = fVar204 * fVar217;
            auVar26._24_4_ = fVar206 * fVar218;
            auVar26._28_4_ = local_8e0._28_4_;
            auVar27._4_4_ = fVar240 * fVar132;
            auVar27._0_4_ = fVar237 * fVar130;
            auVar27._8_4_ = fVar241 * fVar156;
            auVar27._12_4_ = fVar242 * fVar165;
            auVar27._16_4_ = fVar243 * fVar167;
            auVar27._20_4_ = fVar244 * fVar169;
            auVar27._24_4_ = fVar245 * fVar174;
            auVar27._28_4_ = uVar4;
            auVar113 = vsubps_avx(auVar27,auVar26);
            auVar28._4_4_ = fVar140 * fVar132;
            auVar28._0_4_ = fVar135 * fVar130;
            auVar28._8_4_ = fVar143 * fVar156;
            auVar28._12_4_ = fVar146 * fVar165;
            auVar28._16_4_ = fVar149 * fVar167;
            auVar28._20_4_ = fVar152 * fVar169;
            auVar28._24_4_ = fVar155 * fVar174;
            auVar28._28_4_ = auVar192._28_4_;
            auVar29._4_4_ = fVar196 * fVar197;
            auVar29._0_4_ = fVar190 * fVar191;
            auVar29._8_4_ = fVar198 * fVar199;
            auVar29._12_4_ = fVar200 * fVar201;
            auVar29._16_4_ = fVar202 * fVar203;
            auVar29._20_4_ = fVar204 * fVar205;
            auVar29._24_4_ = fVar206 * fVar207;
            auVar29._28_4_ = auVar78._28_4_;
            auVar78 = vsubps_avx(auVar29,auVar28);
            auVar192 = vandps_avx(auVar26,auVar116);
            auVar63 = vandps_avx(auVar28,auVar116);
            auVar192 = vcmpps_avx(auVar192,auVar63,1);
            local_980 = vblendvps_avx(auVar78,auVar113,auVar192);
            auVar30._4_4_ = fVar133 * fVar197;
            auVar30._0_4_ = fVar131 * fVar191;
            auVar30._8_4_ = fVar163 * fVar199;
            auVar30._12_4_ = fVar166 * fVar201;
            auVar30._16_4_ = fVar168 * fVar203;
            auVar30._20_4_ = fVar170 * fVar205;
            auVar30._24_4_ = fVar175 * fVar207;
            auVar30._28_4_ = auVar192._28_4_;
            auVar31._4_4_ = fVar133 * fVar212;
            auVar31._0_4_ = fVar131 * fVar208;
            auVar31._8_4_ = fVar163 * fVar214;
            auVar31._12_4_ = fVar166 * fVar215;
            auVar31._16_4_ = fVar168 * fVar216;
            auVar31._20_4_ = fVar170 * fVar217;
            auVar31._24_4_ = fVar175 * fVar218;
            auVar31._28_4_ = auVar113._28_4_;
            auVar32._4_4_ = fVar225 * fVar132;
            auVar32._0_4_ = fVar219 * fVar130;
            auVar32._8_4_ = fVar227 * fVar156;
            auVar32._12_4_ = fVar229 * fVar165;
            auVar32._16_4_ = fVar231 * fVar167;
            auVar32._20_4_ = fVar233 * fVar169;
            auVar32._24_4_ = fVar235 * fVar174;
            auVar32._28_4_ = auVar63._28_4_;
            auVar78 = vsubps_avx(auVar31,auVar32);
            auVar33._4_4_ = fVar213 * fVar132;
            auVar33._0_4_ = fVar209 * fVar130;
            auVar33._8_4_ = fVar73 * fVar156;
            auVar33._12_4_ = fVar85 * fVar165;
            auVar33._16_4_ = fVar86 * fVar167;
            auVar33._20_4_ = fVar87 * fVar169;
            auVar33._24_4_ = fVar88 * fVar174;
            auVar33._28_4_ = local_860._28_4_;
            auVar113 = vsubps_avx(auVar33,auVar30);
            auVar192 = vandps_avx(auVar32,auVar116);
            auVar63 = vandps_avx(auVar30,auVar116);
            auVar63 = vcmpps_avx(auVar192,auVar63,1);
            local_960 = vblendvps_avx(auVar113,auVar78,auVar63);
            auVar34._4_4_ = fVar196 * fVar213;
            auVar34._0_4_ = fVar190 * fVar209;
            auVar34._8_4_ = fVar198 * fVar73;
            auVar34._12_4_ = fVar200 * fVar85;
            auVar34._16_4_ = fVar202 * fVar86;
            auVar34._20_4_ = fVar204 * fVar87;
            auVar34._24_4_ = fVar206 * fVar88;
            auVar34._28_4_ = auVar63._28_4_;
            auVar35._4_4_ = fVar196 * fVar225;
            auVar35._0_4_ = fVar190 * fVar219;
            auVar35._8_4_ = fVar198 * fVar227;
            auVar35._12_4_ = fVar200 * fVar229;
            auVar35._16_4_ = fVar202 * fVar231;
            auVar35._20_4_ = fVar204 * fVar233;
            auVar35._24_4_ = fVar206 * fVar235;
            auVar35._28_4_ = auVar78._28_4_;
            auVar36._4_4_ = fVar240 * fVar133;
            auVar36._0_4_ = fVar237 * fVar131;
            auVar36._8_4_ = fVar241 * fVar163;
            auVar36._12_4_ = fVar242 * fVar166;
            auVar36._16_4_ = fVar243 * fVar168;
            auVar36._20_4_ = fVar244 * fVar170;
            auVar36._24_4_ = fVar245 * fVar175;
            auVar36._28_4_ = auVar192._28_4_;
            auVar37._4_4_ = fVar133 * fVar140;
            auVar37._0_4_ = fVar131 * fVar135;
            auVar37._8_4_ = fVar163 * fVar143;
            auVar37._12_4_ = fVar166 * fVar146;
            auVar37._16_4_ = fVar168 * fVar149;
            auVar37._20_4_ = fVar170 * fVar152;
            auVar37._24_4_ = fVar175 * fVar155;
            auVar37._28_4_ = auVar172._28_4_;
            auVar78 = vsubps_avx(auVar35,auVar36);
            auVar113 = vsubps_avx(auVar37,auVar34);
            auVar192 = vandps_avx(auVar36,auVar116);
            auVar63 = vandps_avx(auVar34,auVar116);
            auVar63 = vcmpps_avx(auVar192,auVar63,1);
            local_940 = vblendvps_avx(auVar113,auVar78,auVar63);
            fVar60 = fVar127 * local_980._0_4_ +
                     local_960._0_4_ * fVar120 + local_940._0_4_ * local_820;
            fVar70 = fVar127 * local_980._4_4_ +
                     local_960._4_4_ * fVar120 + local_940._4_4_ * local_820;
            fVar129 = fVar127 * local_980._8_4_ +
                      local_960._8_4_ * fVar120 + local_940._8_4_ * local_820;
            fVar130 = fVar127 * local_980._12_4_ +
                      local_960._12_4_ * fVar120 + local_940._12_4_ * local_820;
            fVar131 = fVar127 * local_980._16_4_ +
                      local_960._16_4_ * fVar120 + local_940._16_4_ * local_820;
            fVar132 = fVar127 * local_980._20_4_ +
                      local_960._20_4_ * fVar120 + local_940._20_4_ * local_820;
            fVar120 = fVar127 * local_980._24_4_ +
                      local_960._24_4_ * fVar120 + local_940._24_4_ * local_820;
            fVar127 = auVar192._28_4_ + auVar192._28_4_ + auVar78._28_4_;
            auVar81._0_4_ = fVar60 + fVar60;
            auVar81._4_4_ = fVar70 + fVar70;
            auVar81._8_4_ = fVar129 + fVar129;
            auVar81._12_4_ = fVar130 + fVar130;
            auVar81._16_4_ = fVar131 + fVar131;
            auVar81._20_4_ = fVar132 + fVar132;
            auVar81._24_4_ = fVar120 + fVar120;
            auVar81._28_4_ = fVar127 + fVar127;
            fVar60 = auVar113._28_4_;
            auVar192 = vrcpps_avx(auVar81);
            fVar70 = local_980._0_4_ * fVar134 +
                     local_960._0_4_ * fVar138 + local_940._0_4_ * fVar180;
            fVar129 = local_980._4_4_ * fVar139 +
                      local_960._4_4_ * fVar141 + local_940._4_4_ * fVar183;
            fVar130 = local_980._8_4_ * fVar142 +
                      local_960._8_4_ * fVar144 + local_940._8_4_ * fVar184;
            fVar131 = local_980._12_4_ * fVar145 +
                      local_960._12_4_ * fVar189 + local_940._12_4_ * fVar185;
            fVar132 = local_980._16_4_ * fVar147 +
                      local_960._16_4_ * fVar195 + local_940._16_4_ * fVar186;
            fVar71 = local_980._20_4_ * fVar150 +
                     local_960._20_4_ * fVar71 + local_940._20_4_ * fVar187;
            fVar72 = local_980._24_4_ * fVar153 +
                     local_960._24_4_ * fVar72 + local_940._24_4_ * fVar188;
            fVar133 = fVar60 + fVar60 + fVar127;
            fVar120 = auVar192._0_4_;
            fVar127 = auVar192._4_4_;
            auVar38._4_4_ = auVar81._4_4_ * fVar127;
            auVar38._0_4_ = auVar81._0_4_ * fVar120;
            fVar138 = auVar192._8_4_;
            auVar38._8_4_ = auVar81._8_4_ * fVar138;
            fVar141 = auVar192._12_4_;
            auVar38._12_4_ = auVar81._12_4_ * fVar141;
            fVar144 = auVar192._16_4_;
            auVar38._16_4_ = auVar81._16_4_ * fVar144;
            fVar189 = auVar192._20_4_;
            auVar38._20_4_ = auVar81._20_4_ * fVar189;
            fVar195 = auVar192._24_4_;
            auVar38._24_4_ = auVar81._24_4_ * fVar195;
            auVar38._28_4_ = fVar60;
            auVar136._8_4_ = 0x3f800000;
            auVar136._0_8_ = &DAT_3f8000003f800000;
            auVar136._12_4_ = 0x3f800000;
            auVar136._16_4_ = 0x3f800000;
            auVar136._20_4_ = 0x3f800000;
            auVar136._24_4_ = 0x3f800000;
            auVar136._28_4_ = 0x3f800000;
            auVar192 = vsubps_avx(auVar136,auVar38);
            uVar58 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar117._4_4_ = uVar58;
            auVar117._0_4_ = uVar58;
            auVar117._8_4_ = uVar58;
            auVar117._12_4_ = uVar58;
            auVar117._16_4_ = uVar58;
            auVar117._20_4_ = uVar58;
            auVar117._24_4_ = uVar58;
            auVar117._28_4_ = uVar58;
            local_9a0._4_4_ = (fVar129 + fVar129) * (fVar127 + fVar127 * auVar192._4_4_);
            local_9a0._0_4_ = (fVar70 + fVar70) * (fVar120 + fVar120 * auVar192._0_4_);
            local_9a0._8_4_ = (fVar130 + fVar130) * (fVar138 + fVar138 * auVar192._8_4_);
            local_9a0._12_4_ = (fVar131 + fVar131) * (fVar141 + fVar141 * auVar192._12_4_);
            local_9a0._16_4_ = (fVar132 + fVar132) * (fVar144 + fVar144 * auVar192._16_4_);
            local_9a0._20_4_ = (fVar71 + fVar71) * (fVar189 + fVar189 * auVar192._20_4_);
            local_9a0._24_4_ = (fVar72 + fVar72) * (fVar195 + fVar195 * auVar192._24_4_);
            local_9a0._28_4_ = fVar133 + fVar133;
            auVar192 = vcmpps_avx(auVar117,local_9a0,2);
            fVar120 = ray->tfar;
            auVar118._4_4_ = fVar120;
            auVar118._0_4_ = fVar120;
            auVar118._8_4_ = fVar120;
            auVar118._12_4_ = fVar120;
            auVar118._16_4_ = fVar120;
            auVar118._20_4_ = fVar120;
            auVar118._24_4_ = fVar120;
            auVar118._28_4_ = fVar120;
            auVar63 = vcmpps_avx(local_9a0,auVar118,2);
            auVar192 = vandps_avx(auVar192,auVar63);
            auVar63 = vcmpps_avx(auVar81,_DAT_02020f00,4);
            auVar192 = vandps_avx(auVar63,auVar192);
            auVar62 = vpslld_avx(auVar192._0_16_,0x1f);
            auVar109 = vpsrad_avx(auVar62,0x1f);
            auVar62 = vpslld_avx(auVar192._16_16_,0x1f);
            auVar62 = vpsrad_avx(auVar62,0x1f);
            auVar82._16_16_ = auVar62;
            auVar82._0_16_ = auVar109;
            auVar192 = vandps_avx(local_920,local_8e0);
            auVar63 = auVar192 & auVar82;
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar63 >> 0x7f,0) == '\0') &&
                  (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar63 >> 0xbf,0) == '\0') &&
                (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar63[0x1f]) goto LAB_002e28fc;
            local_a00 = vandps_avx(auVar82,auVar192);
            local_8a0._8_8_ = auVar158._8_8_;
            local_8a0._16_8_ = auVar159._16_8_;
            local_8a0._24_8_ = auVar161._24_8_;
            uStack_a78 = local_8a0._8_8_;
            uStack_a70 = local_8a0._16_8_;
            uStack_a68 = local_8a0._24_8_;
            local_8c0._8_8_ = auVar122._8_8_;
            local_8c0._16_8_ = auVar123._16_8_;
            local_8c0._24_8_ = auVar125._24_8_;
            uStack_a58 = local_8c0._8_8_;
            uStack_a50 = local_8c0._16_8_;
            uStack_a48 = local_8c0._24_8_;
            local_900._8_8_ = auVar103._8_8_;
            local_900._16_8_ = auVar104._16_8_;
            local_900._24_8_ = auVar106._24_8_;
            uStack_a38 = local_900._8_8_;
            uStack_a30 = local_900._16_8_;
            uStack_a28 = local_900._24_8_;
            local_a20 = &local_b48;
            pGVar47 = (local_c08->scene->geometries).items[(long)local_c00].ptr;
            auVar182 = ZEXT1664(local_c20);
            auVar194 = ZEXT1664(local_c30);
            auVar211 = ZEXT1664(local_c40);
            auVar224 = ZEXT1664(local_c50);
            auVar239 = ZEXT1664(local_c60);
            if ((pGVar47->mask & ray->mask) != 0) {
              if ((local_c08->args->filter == (RTCFilterFunctionN)0x0) &&
                 (bVar59 = true, pGVar47->occlusionFilterN == (RTCFilterFunctionN)0x0))
              goto LAB_002e279d;
              _auStack_b98 = auVar105._8_24_;
              local_ba0 = (byte *)local_c08->args;
              auStack_bd8 = auVar68._8_24_;
              local_be0 = pGVar47;
              auStack_bbc = auVar172._4_28_;
              local_bc0 = local_b6c;
              auVar42._16_8_ = local_900._16_8_;
              auVar42._0_16_ = auVar103;
              auVar42._24_8_ = local_900._24_8_;
              auVar69._8_4_ = 0x7fffffff;
              auVar69._0_8_ = 0x7fffffff7fffffff;
              auVar69._12_4_ = 0x7fffffff;
              auVar69._16_4_ = 0x7fffffff;
              auVar69._20_4_ = 0x7fffffff;
              auVar69._24_4_ = 0x7fffffff;
              auVar69._28_4_ = 0x7fffffff;
              auVar192 = vandps_avx(auVar42,auVar69);
              auVar83._8_4_ = 0x219392ef;
              auVar83._0_8_ = 0x219392ef219392ef;
              auVar83._12_4_ = 0x219392ef;
              auVar83._16_4_ = 0x219392ef;
              auVar83._20_4_ = 0x219392ef;
              auVar83._24_4_ = 0x219392ef;
              auVar83._28_4_ = 0x219392ef;
              auVar192 = vcmpps_avx(auVar192,auVar83,5);
              auVar63 = vrcpps_avx(auVar42);
              fVar120 = auVar63._0_4_;
              fVar127 = auVar63._4_4_;
              auVar39._4_4_ = fVar151 * fVar127;
              auVar39._0_4_ = fVar148 * fVar120;
              fVar138 = auVar63._8_4_;
              auVar39._8_4_ = auVar103._8_4_ * fVar138;
              fVar141 = auVar63._12_4_;
              auVar39._12_4_ = auVar103._12_4_ * fVar141;
              fVar144 = auVar63._16_4_;
              auVar39._16_4_ = auVar104._16_4_ * fVar144;
              fVar189 = auVar63._20_4_;
              auVar39._20_4_ = auVar104._20_4_ * fVar189;
              fVar195 = auVar63._24_4_;
              auVar39._24_4_ = auVar106._24_4_ * fVar195;
              auVar39._28_4_ = auVar106._28_4_;
              auVar97._8_4_ = 0x3f800000;
              auVar97._0_8_ = &DAT_3f8000003f800000;
              auVar97._12_4_ = 0x3f800000;
              auVar97._16_4_ = 0x3f800000;
              auVar97._20_4_ = 0x3f800000;
              auVar97._24_4_ = 0x3f800000;
              auVar97._28_4_ = 0x3f800000;
              auVar78 = vsubps_avx(auVar97,auVar39);
              auVar66._0_4_ = fVar120 + fVar120 * auVar78._0_4_;
              auVar66._4_4_ = fVar127 + fVar127 * auVar78._4_4_;
              auVar66._8_4_ = fVar138 + fVar138 * auVar78._8_4_;
              auVar66._12_4_ = fVar141 + fVar141 * auVar78._12_4_;
              auVar66._16_4_ = fVar144 + fVar144 * auVar78._16_4_;
              auVar66._20_4_ = fVar189 + fVar189 * auVar78._20_4_;
              auVar66._24_4_ = fVar195 + fVar195 * auVar78._24_4_;
              auVar66._28_4_ = auVar63._28_4_ + auVar78._28_4_;
              auVar192 = vandps_avx(auVar192,auVar66);
              auVar40._4_4_ = auVar192._4_4_ * fVar164;
              auVar40._0_4_ = auVar192._0_4_ * fVar157;
              auVar40._8_4_ = auVar192._8_4_ * auVar158._8_4_;
              auVar40._12_4_ = auVar192._12_4_ * auVar158._12_4_;
              auVar40._16_4_ = auVar192._16_4_ * auVar159._16_4_;
              auVar40._20_4_ = auVar192._20_4_ * auVar159._20_4_;
              auVar40._24_4_ = auVar192._24_4_ * auVar161._24_4_;
              auVar40._28_4_ = auVar66._28_4_;
              auVar63 = vminps_avx(auVar40,auVar97);
              auVar41._4_4_ = auVar192._4_4_ * fVar128;
              auVar41._0_4_ = auVar192._0_4_ * fVar121;
              auVar41._8_4_ = auVar192._8_4_ * auVar122._8_4_;
              auVar41._12_4_ = auVar192._12_4_ * auVar122._12_4_;
              auVar41._16_4_ = auVar192._16_4_ * auVar123._16_4_;
              auVar41._20_4_ = auVar192._20_4_ * auVar123._20_4_;
              auVar41._24_4_ = auVar192._24_4_ * auVar125._24_4_;
              auVar41._28_4_ = auVar192._28_4_;
              auVar192 = vminps_avx(auVar41,auVar97);
              auVar62 = *(undefined1 (*) [16])(*local_b48 + local_b40 * 4);
              auVar109 = auVar62;
              if (2 < local_b38) {
                auVar109 = *(undefined1 (*) [16])(*local_b48 + local_b40 * 8);
              }
              auVar112 = *local_b48;
              if (local_b40 == 2) {
                auVar112 = vpshufd_avx(auVar112,0x54);
                auVar62 = vpshufd_avx(auVar62,0x54);
                auVar109 = vpshufd_avx(auVar109,0x54);
              }
              auVar111._16_16_ = auVar62;
              auVar111._0_16_ = auVar112;
              auVar119._16_16_ = auVar109;
              auVar119._0_16_ = auVar62;
              auVar78 = vunpcklps_avx(auVar111,auVar119);
              auVar112 = vpshufd_avx(auVar112,0xa5);
              auVar61 = vpshufd_avx(auVar62,0xa5);
              auVar126._16_16_ = auVar61;
              auVar126._0_16_ = auVar112;
              auVar62 = vpshufd_avx(auVar62,0x94);
              auVar109 = vpshufd_avx(auVar109,0x94);
              auVar67._16_16_ = auVar109;
              auVar67._0_16_ = auVar62;
              auVar162._0_16_ = vpsrld_avx(auVar78._0_16_,0x10);
              auVar171 = vpsrld_avx(auVar78._16_16_,0x10);
              auVar137._8_4_ = 0xffff;
              auVar137._0_8_ = 0xffff0000ffff;
              auVar137._12_4_ = 0xffff;
              auVar137._16_4_ = 0xffff;
              auVar137._20_4_ = 0xffff;
              auVar137._24_4_ = 0xffff;
              auVar137._28_4_ = 0xffff;
              auVar78 = vandps_avx(auVar137,auVar78);
              auVar105 = vcvtdq2ps_avx(auVar78);
              auVar162._16_16_ = auVar171;
              auVar113 = vcvtdq2ps_avx(auVar162);
              auVar107._0_16_ = vpsrld_avx(auVar112,0x10);
              auVar112 = vpsrld_avx(auVar61,0x10);
              auVar78 = vandps_avx(auVar137,auVar126);
              auVar172 = vcvtdq2ps_avx(auVar78);
              auVar107._16_16_ = auVar112;
              auVar68 = vcvtdq2ps_avx(auVar107);
              auVar84._0_16_ = vpsrld_avx(auVar62,0x10);
              auVar62 = vpsrld_avx(auVar109,0x10);
              auVar78 = vandps_avx(auVar137,auVar67);
              auVar78 = vcvtdq2ps_avx(auVar78);
              auVar84._16_16_ = auVar62;
              auVar7 = vcvtdq2ps_avx(auVar84);
              auVar108._8_4_ = 0x3f800000;
              auVar108._0_8_ = &DAT_3f8000003f800000;
              auVar108._12_4_ = 0x3f800000;
              auVar108._16_4_ = 0x3f800000;
              auVar108._20_4_ = 0x3f800000;
              auVar108._24_4_ = 0x3f800000;
              auVar108._28_4_ = 0x3f800000;
              auVar8 = vsubps_avx(auVar108,auVar63);
              auVar8 = vsubps_avx(auVar8,auVar192);
              local_9e0._0_4_ =
                   auVar192._0_4_ * auVar78._0_4_ * 0.00012207031 +
                   auVar63._0_4_ * auVar172._0_4_ * 0.00012207031 +
                   auVar8._0_4_ * auVar105._0_4_ * 0.00012207031;
              local_9e0._4_4_ =
                   auVar192._4_4_ * auVar78._4_4_ * 0.00012207031 +
                   auVar63._4_4_ * auVar172._4_4_ * 0.00012207031 +
                   auVar8._4_4_ * auVar105._4_4_ * 0.00012207031;
              local_9e0._8_4_ =
                   auVar192._8_4_ * auVar78._8_4_ * 0.00012207031 +
                   auVar63._8_4_ * auVar172._8_4_ * 0.00012207031 +
                   auVar8._8_4_ * auVar105._8_4_ * 0.00012207031;
              local_9e0._12_4_ =
                   auVar192._12_4_ * auVar78._12_4_ * 0.00012207031 +
                   auVar63._12_4_ * auVar172._12_4_ * 0.00012207031 +
                   auVar8._12_4_ * auVar105._12_4_ * 0.00012207031;
              local_9e0._16_4_ =
                   auVar192._16_4_ * auVar78._16_4_ * 0.00012207031 +
                   auVar63._16_4_ * auVar172._16_4_ * 0.00012207031 +
                   auVar8._16_4_ * auVar105._16_4_ * 0.00012207031;
              local_9e0._20_4_ =
                   auVar192._20_4_ * auVar78._20_4_ * 0.00012207031 +
                   auVar63._20_4_ * auVar172._20_4_ * 0.00012207031 +
                   auVar8._20_4_ * auVar105._20_4_ * 0.00012207031;
              local_9e0._24_4_ =
                   auVar192._24_4_ * auVar78._24_4_ * 0.00012207031 +
                   auVar63._24_4_ * auVar172._24_4_ * 0.00012207031 +
                   auVar8._24_4_ * auVar105._24_4_ * 0.00012207031;
              local_9e0._28_4_ = auVar78._28_4_ + 0.0 + auVar192._28_4_;
              local_9c0[1] = auVar192._4_4_ * auVar7._4_4_ * 0.00012207031 +
                             auVar63._4_4_ * auVar68._4_4_ * 0.00012207031 +
                             auVar113._4_4_ * 0.00012207031 * auVar8._4_4_;
              local_9c0[0] = auVar192._0_4_ * auVar7._0_4_ * 0.00012207031 +
                             auVar63._0_4_ * auVar68._0_4_ * 0.00012207031 +
                             auVar113._0_4_ * 0.00012207031 * auVar8._0_4_;
              local_9c0[2] = auVar192._8_4_ * auVar7._8_4_ * 0.00012207031 +
                             auVar63._8_4_ * auVar68._8_4_ * 0.00012207031 +
                             auVar113._8_4_ * 0.00012207031 * auVar8._8_4_;
              local_9c0[3] = auVar192._12_4_ * auVar7._12_4_ * 0.00012207031 +
                             auVar63._12_4_ * auVar68._12_4_ * 0.00012207031 +
                             auVar113._12_4_ * 0.00012207031 * auVar8._12_4_;
              fStack_9b0 = auVar192._16_4_ * auVar7._16_4_ * 0.00012207031 +
                           auVar63._16_4_ * auVar68._16_4_ * 0.00012207031 +
                           auVar113._16_4_ * 0.00012207031 * auVar8._16_4_;
              fStack_9ac = auVar192._20_4_ * auVar7._20_4_ * 0.00012207031 +
                           auVar63._20_4_ * auVar68._20_4_ * 0.00012207031 +
                           auVar113._20_4_ * 0.00012207031 * auVar8._20_4_;
              fStack_9a8 = auVar192._24_4_ * auVar7._24_4_ * 0.00012207031 +
                           auVar63._24_4_ * auVar68._24_4_ * 0.00012207031 +
                           auVar113._24_4_ * 0.00012207031 * auVar8._24_4_;
              fStack_9a4 = auVar7._28_4_ + auVar68._28_4_ + auVar8._28_4_;
              iVar43 = vmovmskps_avx(local_a00);
              local_c80 = CONCAT44((int)((ulong)local_b48 >> 0x20),iVar43);
              lVar46 = 0;
              if (local_c80 != 0) {
                for (; (local_c80 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              _auStack_c78 = auVar67._8_24_;
              bVar59 = iVar43 != 0;
              if (bVar59) {
                auStack_ab8 = auVar221._8_24_;
                local_ac0 = local_c08->user;
                local_a80 = auVar158._0_8_;
                local_a60 = auVar122._0_8_;
                local_a40 = auVar103._0_8_;
                local_900 = auVar114;
                local_8c0 = auVar9;
                local_8a0 = auVar79;
                local_860 = auVar10;
                do {
                  local_b74 = local_9c0[lVar46 + -8];
                  local_b70 = local_9c0[lVar46];
                  local_b00._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_9a0 + lVar46 * 4);
                  local_b80 = *(undefined4 *)(local_980 + lVar46 * 4);
                  local_b7c = *(undefined4 *)(local_960 + lVar46 * 4);
                  local_ae0 = (undefined1  [8])lVar46;
                  local_b78 = *(undefined4 *)(local_940 + lVar46 * 4);
                  local_b68 = local_c00._0_4_;
                  local_b64 = local_ac0->instID[0];
                  local_b60 = local_ac0->instPrimID[0];
                  local_c84 = -1;
                  local_b30.valid = &local_c84;
                  local_b30.geometryUserPtr = pGVar47->userPtr;
                  local_b30.context = local_ac0;
                  local_b30.hit = (RTCHitN *)&local_b80;
                  local_b30.N = 1;
                  local_b30.ray = (RTCRayN *)ray;
                  uVar58 = local_b6c;
                  if (pGVar47->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e2686:
                    if (*(code **)(local_ba0 + 0x10) == (code *)0x0) break;
                    if (((*local_ba0 & 2) != 0) || (((pGVar47->field_8).field_0x2 & 0x40) != 0)) {
                      (**(code **)(local_ba0 + 0x10))(&local_b30);
                      auVar239 = ZEXT1664(local_c60);
                      auVar224 = ZEXT1664(local_c50);
                      auVar211 = ZEXT1664(local_c40);
                      auVar194 = ZEXT1664(local_c30);
                      auVar182 = ZEXT1664(local_c20);
                      pGVar47 = local_be0;
                      uVar58 = local_bc0;
                    }
                    if (*local_b30.valid != 0) break;
                  }
                  else {
                    (*pGVar47->occlusionFilterN)(&local_b30);
                    auVar239 = ZEXT1664(local_c60);
                    auVar224 = ZEXT1664(local_c50);
                    auVar211 = ZEXT1664(local_c40);
                    auVar194 = ZEXT1664(local_c30);
                    auVar182 = ZEXT1664(local_c20);
                    pGVar47 = local_be0;
                    uVar58 = local_bc0;
                    if (*local_b30.valid != 0) goto LAB_002e2686;
                  }
                  local_b6c = uVar58;
                  ray->tfar = (float)local_b00._0_4_;
                  uVar54 = local_c80 ^ 1L << ((ulong)local_ae0 & 0x3f);
                  lVar46 = 0;
                  if (uVar54 != 0) {
                    for (; (uVar54 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                    }
                  }
                  local_c80 = uVar54;
                  bVar59 = uVar54 != 0;
                } while (bVar59);
                goto LAB_002e279d;
              }
              goto LAB_002e2917;
            }
            bVar59 = false;
          }
LAB_002e279d:
          uVar54 = 0;
        }
        else {
          local_d28 = *(long *)(uVar54 & 0xfffffffffffffff0);
          fVar127 = (float)(*(int *)(local_d28 + 8) - 1);
          fVar120 = fVar127 * (ray->dir).field_0.m128[3];
          auVar62 = vroundss_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),9);
          auVar62 = vminss_avx(auVar62,ZEXT416((uint)(fVar127 + -1.0)));
          auVar62 = vmaxss_avx(ZEXT816(0) << 0x20,auVar62);
          local_a90 = ZEXT416((uint)(fVar120 - auVar62._0_4_));
          local_c88 = (int)auVar62._0_4_;
          uVar54 = *(ulong *)(local_d28 + 0x30 +
                             (ulong)*(uint *)(local_d28 + 0x2c) + (long)local_c88 * 8);
          bVar59 = false;
        }
        if (bVar59) {
          ray->tfar = -INFINITY;
          iStack_d68 = 3;
        }
        else {
          iStack_d68 = 0;
          if (uVar54 != 0) {
            *puVar56 = uVar54;
            puVar56 = puVar56 + 1;
            iStack_d68 = 0;
          }
        }
      }
    } while (iStack_d68 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }